

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_mathWithNamespacesDefinedOnTheNodeThatUsesNamespace_Test::
~Parser_mathWithNamespacesDefinedOnTheNodeThatUsesNamespace_Test
          (Parser_mathWithNamespacesDefinedOnTheNodeThatUsesNamespace_Test *this)

{
  Parser_mathWithNamespacesDefinedOnTheNodeThatUsesNamespace_Test *this_local;
  
  ~Parser_mathWithNamespacesDefinedOnTheNodeThatUsesNamespace_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, mathWithNamespacesDefinedOnTheNodeThatUsesNamespace)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\" name=\"model_name\">\n"
        "  <component name=\"\">\n"
        "  <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "    <apply>\n"
        "      <eq/>\n"
        "      <ci>b2</ci>\n"
        "      <apply>\n"
        "        <times/>\n"
        "        <cn xmlns:cellml=\"http://www.cellml.org/cellml/2.0#\" cellml:units=\"dimensionless\">2.0</cn>\n"
        "        <ci>d</ci>\n"
        "      </apply>\n"
        "    </apply>\n"
        "  </math>\n"
        "  </component>\n"
        "</model>\n";

    libcellml::ParserPtr parser = libcellml::Parser::create();
    parser->parseModel(in);

    EXPECT_EQ(size_t(0), parser->issueCount());
}